

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_insert_at(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  undefined4 *in_RCX;
  char *unaff_retaddr;
  int idx;
  vm_val_t *in_stack_00000010;
  uint argc;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  int in_stack_fffffffffffffff8;
  uint in_stack_fffffffffffffffc;
  
  if (in_RCX == (undefined4 *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *in_RCX;
  }
  if ((getp_insert_at(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_insert_at(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_insert_at::desc,2,0,1);
    __cxa_guard_release(&getp_insert_at(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (CVmNativeCodeDesc *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 1) {
      vmb_get_len((char *)0x36e018);
    }
    insert_elements(in_stack_00000010,_idx,unaff_retaddr,in_stack_fffffffffffffffc,
                    in_stack_fffffffffffffff8);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_insert_at(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *lst, uint *in_argc)
{
    /* check arguments - we need at least two */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the index value; adjust negative values */
    int idx = CVmBif::pop_int_val(vmg0_);
    if (idx <= 0)
        idx += vmb_get_len(lst) + 1;

    /* adjust to zero-based indexing */
    idx -= 1;

    /* 
     *   Insert the element (there's just one) at the start of the list.
     *   Note that we must decrement the argument count we got, since we
     *   already took off the first argument (the index value). 
     */
    insert_elements(vmg_ retval, self_val, lst, argc - 1, idx);

    /* handled */
    return TRUE;
}